

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointLight.cpp
# Opt level: O3

double __thiscall PointLight::shadow(PointLight *this,Scene *scene,Vector *p,Vector *l)

{
  undefined1 auVar1 [16];
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined1 auVar3 [16];
  double dVar4;
  double t;
  SurfaceData texture;
  double local_108;
  double local_100;
  double local_f8;
  undefined8 uStack_f0;
  Vector local_e8;
  undefined1 local_d0 [16];
  double local_c0;
  SurfaceData local_b0;
  GeometricObject *this_00;
  
  local_c0 = (this->loc).z - p->z;
  auVar3._0_8_ = (this->loc).x - p->x;
  auVar3._8_8_ = (this->loc).y - p->y;
  local_f8 = SQRT(local_c0 * local_c0 + auVar3._0_8_ * auVar3._0_8_ + auVar3._8_8_ * auVar3._8_8_);
  dVar4 = this->dist_scale / local_f8;
  dVar4 = dVar4 * dVar4;
  auVar1._8_4_ = SUB84(local_f8,0);
  auVar1._0_8_ = local_f8;
  auVar1._12_4_ = (int)((ulong)local_f8 >> 0x20);
  local_d0 = divpd(auVar3,auVar1);
  l->x = (double)local_d0._0_8_;
  l->y = (double)local_d0._8_8_;
  uStack_f0 = 0;
  local_c0 = local_c0 / local_f8;
  l->z = local_c0;
  local_e8.x = p->x;
  local_e8.y = p->y;
  local_e8.z = p->z;
  iVar2 = (*scene->_vptr_Scene[2])(scene,&local_e8,&local_100);
  this_00 = (GeometricObject *)CONCAT44(extraout_var,iVar2);
  if ((this_00 != (GeometricObject *)0x0) && (local_100 < local_f8)) {
    local_108 = dVar4;
    while( true ) {
      local_e8.z = local_c0 * local_100 + local_e8.z;
      local_e8.x = local_100 * (double)local_d0._0_8_ + local_e8.x;
      local_e8.y = local_100 * (double)local_d0._8_8_ + local_e8.y;
      GeometricObject::find_texture(this_00,&local_e8,&local_b0);
      dVar4 = 0.0;
      if ((local_b0.kt < threshold) || (local_108 = local_108 * local_b0.kt, local_108 < threshold))
      break;
      local_f8 = local_f8 - local_100;
      iVar2 = (*scene->_vptr_Scene[2])(scene,&local_e8,&local_100);
      this_00 = (GeometricObject *)CONCAT44(extraout_var_00,iVar2);
      if (this_00 == (GeometricObject *)0x0) {
        return local_108;
      }
      if (local_f8 <= local_100) {
        return local_108;
      }
    }
  }
  return dVar4;
}

Assistant:

double PointLight::shadow(Scene* scene, Vector&  p, Vector& l)
{
   l = loc - p;

   double t;
   double dist = !l;
   double attenuation = dist_scale  / dist;
   attenuation = attenuation *   attenuation;

   l /= dist;

   Ray   r(p,l);
   SurfaceData texture;
   GeometricObject *occlude;

   while ((occlude = scene->intersect(r,t)) != 0 && dist > t)
   {
      r.org = r.point(t);

      occlude->find_texture(r.org, texture);

      if (texture.kt < threshold) return 0; // объект непрозрачен
      if ((attenuation *= texture.kt) < threshold) return 0;
      dist -= t;
   }
   return attenuation;
}